

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O0

void __thiscall Am_Font_Data::Print(Am_Font_Data *this,ostream *os)

{
  ostream *poVar1;
  void *pvVar2;
  char *lookup_name;
  ostream *os_local;
  Am_Font_Data *this_local;
  
  if (this->name == (char *)0x0) {
    poVar1 = std::operator<<(os,"Am_Font(");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::hex);
    pvVar2 = (void *)std::ostream::operator<<(pvVar2,(ulong)this);
    poVar1 = (ostream *)std::ostream::operator<<(pvVar2,std::dec);
    std::operator<<(poVar1,")=[");
    switch(this->family) {
    case Am_FONT_FIXED:
      std::operator<<(os,"FIXED");
      break;
    case Am_FONT_SERIF:
      std::operator<<(os,"SERIF");
      break;
    case Am_FONT_SANS_SERIF:
      std::operator<<(os,"SANS_SERIF");
      break;
    case Am_FONT_JFIXED:
      std::operator<<(os,"JFIXED");
      break;
    case Am_FONT_JPROPORTIONAL:
      std::operator<<(os,"JPROPORTIONAL");
      break;
    case Am_FONT_CFIXED:
      std::operator<<(os,"CFIXED");
      break;
    case Am_FONT_KFIXED:
      std::operator<<(os,"KFIXED");
    }
    if ((this->bold & 1U) != 0) {
      std::operator<<(os,", BOLD");
    }
    if ((this->italic & 1U) != 0) {
      std::operator<<(os,", ITALIC");
    }
    if ((this->underline & 1U) != 0) {
      std::operator<<(os,", UNDERLINE");
    }
    switch(this->size) {
    case Am_FONT_SMALL:
      std::operator<<(os,", SMALL");
      break;
    case Am_FONT_MEDIUM:
      std::operator<<(os,", MEDIUM");
      break;
    case Am_FONT_LARGE:
      std::operator<<(os,", LARGE");
      break;
    case Am_FONT_VERY_LARGE:
      std::operator<<(os,", VERY_LARGE");
      break;
    case Am_FONT_TSMALL:
      std::operator<<(os,", TSMALL");
      break;
    case Am_FONT_TMEDIUM:
      std::operator<<(os,", TMEDIUM");
      break;
    case Am_FONT_TLARGE:
      std::operator<<(os,", TLARGE");
      break;
    case Am_FONT_TVERY_LARGE:
      std::operator<<(os,", TVERY_LARGE");
    }
    std::operator<<(os,"]");
  }
  else {
    poVar1 = std::operator<<(os,"Am_Font From File(");
    poVar1 = std::operator<<(poVar1,this->name);
    std::operator<<(poVar1,")");
  }
  return;
}

Assistant:

void
Am_Font_Data::Print(std::ostream &os) const
{
  const char *lookup_name = nullptr;
#ifdef DEBUG
  lookup_name = Am_Get_Name_Of_Item(this);
#endif
  if (lookup_name)
    os << lookup_name;
  else if (name)
    os << "Am_Font From File(" << name << ")";
  else {
    os << "Am_Font(" << std::hex << (unsigned long)this << std::dec << ")=[";
    switch (family) {
    case Am_FONT_FIXED:
      os << "FIXED";
      break;
    case Am_FONT_SERIF:
      os << "SERIF";
      break;
    case Am_FONT_SANS_SERIF:
      os << "SANS_SERIF";
      break;
    case Am_FONT_JFIXED:
      os << "JFIXED";
      break;
    case Am_FONT_JPROPORTIONAL:
      os << "JPROPORTIONAL";
      break;
    case Am_FONT_CFIXED:
      os << "CFIXED";
      break;
    case Am_FONT_KFIXED:
      os << "KFIXED";
      break;
    }
    if (bold)
      os << ", BOLD";
    if (italic)
      os << ", ITALIC";
    if (underline)
      os << ", UNDERLINE";
    switch (size) {
    case Am_FONT_SMALL:
      os << ", SMALL";
      break;
    case Am_FONT_MEDIUM:
      os << ", MEDIUM";
      break;
    case Am_FONT_LARGE:
      os << ", LARGE";
      break;
    case Am_FONT_VERY_LARGE:
      os << ", VERY_LARGE";
      break;
    case Am_FONT_TSMALL:
      os << ", TSMALL";
      break;
    case Am_FONT_TMEDIUM:
      os << ", TMEDIUM";
      break;
    case Am_FONT_TLARGE:
      os << ", TLARGE";
      break;
    case Am_FONT_TVERY_LARGE:
      os << ", TVERY_LARGE";
      break;
    }
    os << "]";
  }
}